

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::output_rank_example(vw *all,example *head_ec,bool *hit_loss,multi_ex *ec_seq)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  _Ios_Openmode _Var5;
  v_array<ACTION_SCORE::action_score> *this;
  ulong uVar6;
  reference ppeVar7;
  action_score *paVar8;
  v_array<int> *this_00;
  int **ppiVar9;
  size_t sVar10;
  wclass *pwVar11;
  ostream *poVar12;
  undefined8 in_RCX;
  byte *in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t i;
  stringstream outputStringStream;
  string outputString;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  example *ex;
  iterator __end2;
  iterator __begin2;
  multi_ex *__range2;
  size_t idx;
  v_array<ACTION_SCORE::action_score> *preds;
  float loss;
  v_array<COST_SENSITIVE::wclass> costs;
  label *ld;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  example *in_stack_fffffffffffffcf8;
  example *in_stack_fffffffffffffd08;
  code *pcVar13;
  string local_280 [32];
  ulong local_260;
  stringstream local_248 [16];
  ostream local_238;
  v_array<char> *in_stack_ffffffffffffff30;
  v_array<ACTION_SCORE::action_score> *in_stack_ffffffffffffff38;
  string local_c0 [4];
  int in_stack_ffffffffffffff44;
  int *local_90;
  example *in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 is_test;
  vw *in_stack_ffffffffffffffa0;
  float local_4c;
  v_array<COST_SENSITIVE::wclass> local_48;
  undefined8 *local_28;
  undefined8 local_20;
  byte *local_18;
  long local_10;
  long *local_8;
  
  local_28 = (undefined8 *)(in_RSI + 0x6828);
  local_48._begin = (wclass *)*local_28;
  local_48._end = *(wclass **)(in_RSI + 0x6830);
  local_48.end_array = *(wclass **)(in_RSI + 0x6838);
  local_48.erase_count = *(size_t *)(in_RSI + 0x6840);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar4 = example_is_newline((example *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  if ((iVar4 == 0) && (bVar3 = ec_is_label_definition(in_stack_fffffffffffffd08), !bVar3)) {
    *(long *)(*local_8 + 0x10) = *(long *)(local_10 + 0x68a0) + *(long *)(*local_8 + 0x10);
    local_4c = 0.0;
    this = (v_array<ACTION_SCORE::action_score> *)(local_10 + 0x6850);
    uVar6 = (*(code *)PTR_test_label_00478cb0)(local_10 + 0x6828);
    if ((uVar6 & 1) == 0) {
      in_stack_ffffffffffffffa0 = (vw *)0x0;
      in_stack_ffffffffffffff90 =
           std::vector<example_*,_std::allocator<example_*>_>::begin
                     ((vector<example_*,_std::allocator<example_*>_> *)
                      CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      in_stack_ffffffffffffff88 =
           std::vector<example_*,_std::allocator<example_*>_>::end
                     ((vector<example_*,_std::allocator<example_*>_> *)
                      CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      in_stack_ffffffffffffff98 = local_20;
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)),
            bVar3) {
        ppeVar7 = __gnu_cxx::
                  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                  ::operator*((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                               *)&stack0xffffffffffffff90);
        in_stack_ffffffffffffff80 = *ppeVar7;
        bVar3 = COST_SENSITIVE::ec_is_example_header(in_stack_fffffffffffffcf8);
        if (!bVar3) {
          if ((*local_18 & 1) != 0) break;
          paVar8 = v_array<ACTION_SCORE::action_score>::operator[](this,0);
          if ((vw *)(ulong)paVar8->action == in_stack_ffffffffffffffa0) {
            pwVar11 = v_array<COST_SENSITIVE::wclass>::operator[]
                                ((v_array<COST_SENSITIVE::wclass> *)
                                 &(in_stack_ffffffffffffff80->l).simple,0);
            local_4c = pwVar11->x;
            *local_18 = 1;
          }
          in_stack_ffffffffffffffa0 = (vw *)((long)&in_stack_ffffffffffffffa0->sd + 1);
        }
        __gnu_cxx::
        __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
        operator++((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                    *)&stack0xffffffffffffff90);
      }
      *(double *)(*local_8 + 0x40) = (double)local_4c + *(double *)(*local_8 + 0x40);
      *(double *)(*local_8 + 0x48) = (double)local_4c + *(double *)(*local_8 + 0x48);
    }
    this_00 = (v_array<int> *)(local_8 + 0x6a2);
    ppiVar9 = v_array<int>::begin(this_00);
    local_90 = *ppiVar9;
    ppiVar9 = v_array<int>::end(this_00);
    piVar1 = *ppiVar9;
    for (; is_test = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38), local_90 != piVar1;
        local_90 = local_90 + 1) {
      ACTION_SCORE::print_action_score
                (in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    }
    if (0 < (int)local_8[0x6a6]) {
      std::__cxx11::string::string(local_c0);
      _Var5 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_248,local_c0,_Var5);
      local_260 = 0;
      while( true ) {
        uVar6 = local_260;
        sVar10 = v_array<COST_SENSITIVE::wclass>::size(&local_48);
        is_test = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
        if (sVar10 <= uVar6) break;
        if (local_260 != 0) {
          std::operator<<(&local_238,' ');
        }
        pwVar11 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,local_260);
        poVar12 = (ostream *)std::ostream::operator<<(&local_238,pwVar11->class_index);
        poVar12 = std::operator<<(poVar12,':');
        pwVar11 = v_array<COST_SENSITIVE::wclass>::operator[](&local_48,local_260);
        std::ostream::operator<<(poVar12,pwVar11->partial_prediction);
        local_260 = local_260 + 1;
      }
      pcVar13 = (code *)local_8[0x6a8];
      lVar2 = local_8[0x6a6];
      std::__cxx11::stringstream::str();
      (*pcVar13)((int)lVar2,local_280);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::stringstream::~stringstream(local_248);
      std::__cxx11::string::~string(local_c0);
    }
    (*(code *)PTR_test_label_00478cb0)(local_10 + 0x6828);
    COST_SENSITIVE::print_update
              (in_stack_ffffffffffffffa0,(bool)is_test,
               (example *)in_stack_ffffffffffffff90._M_current,
               (multi_ex *)in_stack_ffffffffffffff88._M_current,
               SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0),(uint32_t)in_stack_ffffffffffffff80
              );
  }
  return;
}

Assistant:

void output_rank_example(vw& all, example& head_ec, bool& hit_loss, multi_ex* ec_seq)
{
  label& ld = head_ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(head_ec))
    return;
  if (ec_is_label_definition(head_ec))
    return;

  all.sd->total_features += head_ec.num_features;

  float loss = 0.;
  v_array<action_score>& preds = head_ec.pred.a_s;

  if (!COST_SENSITIVE::cs_label.test_label(&head_ec.l))
  {
    size_t idx = 0;
    for (example* ex : *ec_seq)
    {
      if (ec_is_example_header(*ex))
        continue;
      if (hit_loss)
        break;
      if (preds[0].action == idx)
      {
        loss = ex->l.cs.costs[0].x;
        hit_loss = true;
      }
      idx++;
    }
    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
    assert(loss >= 0);
  }

  for (int sink : all.final_prediction_sink) print_action_score(sink, head_ec.pred.a_s, head_ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), head_ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&head_ec.l), head_ec, ec_seq, true, 0);
}